

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.c
# Opt level: O3

int cmdline_read(CMDLINE_OPTION *options,int argc,char **argv,
                _func_int_int_char_ptr_void_ptr *callback,void *userdata)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  char cVar9;
  int *piVar10;
  CMDLINE_OPTION *pCVar11;
  char cVar12;
  char *pcVar13;
  char *__s;
  char auxbuf [33];
  char local_58 [40];
  
  local_58[0x20] = 0;
  if (options->id == 0) {
    bVar2 = false;
  }
  else {
    piVar10 = &options[1].id;
    bVar2 = true;
    do {
      if (((*(byte *)(piVar10 + -5) & 4) != 0) && (**(char **)(piVar10 + -8) != '-')) {
        bVar2 = false;
      }
      iVar6 = *piVar10;
      piVar10 = piVar10 + 6;
    } while (iVar6 != 0);
    bVar2 = !bVar2;
  }
  if (1 < argc) {
    iVar6 = 1;
    bVar3 = false;
    do {
      pcVar13 = argv[iVar6];
      if (bVar3) {
LAB_0010547f:
        iVar5 = (*callback)(0,pcVar13,userdata);
LAB_00105489:
        if (iVar5 != 0) {
          return iVar5;
        }
      }
      else {
        cVar9 = *pcVar13;
        if (cVar9 != '-') {
          if (!bVar2) {
LAB_0010547c:
            bVar3 = false;
            goto LAB_0010547f;
          }
LAB_0010518a:
          iVar5 = options->id;
          if (iVar5 != 0) {
            pcVar8 = pcVar13 + 2;
            pCVar11 = options;
            cVar12 = cVar9;
            do {
              uVar1 = pCVar11->flags;
              __s = pCVar11->longname;
              if ((uVar1 & 4) == 0) {
                if (((__s == (char *)0x0) || (cVar12 != '-')) || (pcVar13[1] != '-')) {
                  if (((pCVar11->shortname != '\0') && (cVar12 = cVar9, cVar9 == '-')) &&
                     (cVar12 = '-', pcVar13[1] == pCVar11->shortname)) {
                    if ((uVar1 & 2) != 0) {
                      __s = pcVar8;
                      if (pcVar13[2] == '\0') {
                        if (iVar6 + 1 < argc) {
                          pcVar13 = argv[iVar6 + 1];
                          goto LAB_00105318;
                        }
                        iVar5 = -0x7ffffffe;
                        __s = pcVar13;
                      }
                      goto LAB_001053ed;
                    }
                    iVar5 = (*callback)(iVar5,(char *)0x0,userdata);
                    if (iVar5 == 0) {
                      if (argv[iVar6][2] == '\0') {
                        iVar5 = 0;
                      }
                      else {
                        iVar5 = cmdline_handle_short_opt_group
                                          (options,argv[iVar6] + 2,callback,userdata);
                      }
                    }
                    goto LAB_001053f4;
                  }
                }
                else {
                  sVar7 = strlen(__s);
                  iVar4 = strncmp(pcVar8,__s,sVar7);
                  cVar12 = '-';
                  if (iVar4 == 0) {
                    if (pcVar13[sVar7 + 2] == '=') {
                      if ((uVar1 & 3) == 0) {
                        snprintf(local_58,0x20,"--%s",__s);
                        iVar5 = -0x7ffffffd;
                        __s = local_58;
                      }
                      else {
                        __s = pcVar8 + sVar7 + 1;
                      }
                    }
                    else {
                      if (pcVar13[sVar7 + 2] != '\0') goto LAB_0010524c;
                      if ((uVar1 & 2) == 0) {
                        __s = (char *)0x0;
                      }
                      else {
                        iVar5 = -0x7ffffffe;
                        __s = pcVar13;
                      }
                    }
LAB_001053ed:
                    iVar5 = (*callback)(iVar5,__s,userdata);
LAB_001053f4:
                    bVar3 = false;
                    if (pCVar11->id != 0) goto LAB_00105489;
                    pcVar13 = argv[iVar6];
                    cVar9 = *pcVar13;
                    break;
                  }
                }
              }
              else {
                sVar7 = strlen(__s);
                iVar4 = strncmp(pcVar13,__s,sVar7);
                if (iVar4 == 0) {
                  if (pcVar13[sVar7] == '\0') {
                    if (iVar6 + 1 < argc) {
                      pcVar13 = argv[iVar6 + 1];
LAB_00105318:
                      iVar6 = iVar6 + 1;
                      iVar5 = (*callback)(iVar5,pcVar13,userdata);
                      goto LAB_001053f4;
                    }
                    iVar5 = -0x7ffffffe;
                  }
                  else {
                    __s = pcVar13 + sVar7;
                  }
                  goto LAB_001053ed;
                }
              }
LAB_0010524c:
              iVar5 = pCVar11[1].id;
              pCVar11 = pCVar11 + 1;
            } while (iVar5 != 0);
          }
          if (cVar9 != '-') goto LAB_0010547c;
          if ((pcVar13[1] == '-') && (pcVar8 = strchr(pcVar13,0x3d), pcVar8 != (char *)0x0)) {
            sVar7 = (long)pcVar8 - (long)pcVar13;
            if (0x1f < sVar7) {
              sVar7 = 0x20;
            }
            strncpy(local_58,pcVar13,sVar7);
            local_58[sVar7] = '\0';
            pcVar13 = local_58;
          }
          iVar5 = (*callback)(-0x7fffffff,pcVar13,userdata);
          bVar3 = false;
          goto LAB_00105489;
        }
        if (pcVar13[1] == '\0') goto LAB_0010547f;
        if ((pcVar13[1] != '-') || (pcVar13[2] != '\0')) goto LAB_0010518a;
        bVar3 = true;
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < argc);
  }
  return 0;
}

Assistant:

int
cmdline_read(const CMDLINE_OPTION* options, int argc, char** argv,
        int (*callback)(int /*optval*/, const char* /*arg*/, void* /*userdata*/),
        void* userdata)
{
    const CMDLINE_OPTION* opt;
    char auxbuf[CMDLINE_AUXBUF_SIZE+1];
    int fast_optarg_decision = 1;
    int after_doubledash = 0;
    int i = 1;
    int ret = 0;

    auxbuf[CMDLINE_AUXBUF_SIZE] = '\0';

    /* Check whether there is any CMDLINE_OPTFLAG_COMPILERLIKE option with
     * a name not starting with '-'. That would imply we can to check for
     * non-option arguments only after refusing all such options. */
    for(opt = options; opt->id != 0; opt++) {
        if((opt->flags & CMDLINE_OPTFLAG_COMPILERLIKE)  &&  opt->longname[0] != '-')
            fast_optarg_decision = 0;
    }

    while(i < argc) {
        if(after_doubledash  ||  strcmp(argv[i], "-") == 0) {
            /* Non-option argument.
             * Standalone "-" usually means "read from stdin" or "write to
             * stdout" so treat it always as a non-option. */
            ret = callback(CMDLINE_OPTID_NONE, argv[i], userdata);
        } else if(strcmp(argv[i], "--") == 0) {
            /* End of options. All the remaining tokens are non-options
             * even if they start with a dash. */
            after_doubledash = 1;
        } else if(fast_optarg_decision  &&  argv[i][0] != '-') {
            /* Non-option argument. */
            ret = callback(CMDLINE_OPTID_NONE, argv[i], userdata);
        } else {
            for(opt = options; opt->id != 0; opt++) {
                if(opt->flags & CMDLINE_OPTFLAG_COMPILERLIKE) {
                    size_t len = strlen(opt->longname);
                    if(strncmp(argv[i], opt->longname, len) == 0) {
                        /* Compiler-like option. */
                        if(argv[i][len] != '\0')
                            ret = callback(opt->id, argv[i] + len, userdata);
                        else if(i+1 < argc)
                            ret = callback(opt->id, argv[++i], userdata);
                        else
                            ret = callback(CMDLINE_OPTID_MISSINGARG, opt->longname, userdata);
                        break;
                    }
                } else if(opt->longname != NULL  &&  strncmp(argv[i], "--", 2) == 0) {
                    size_t len = strlen(opt->longname);
                    if(strncmp(argv[i]+2, opt->longname, len) == 0) {
                        /* Regular long option. */
                        if(argv[i][2+len] == '\0') {
                            /* with no argument provided. */
                            if(!(opt->flags & CMDLINE_OPTFLAG_REQUIREDARG))
                                ret = callback(opt->id, NULL, userdata);
                            else
                                ret = callback(CMDLINE_OPTID_MISSINGARG, argv[i], userdata);
                            break;
                        } else if(argv[i][2+len] == '=') {
                            /* with an argument provided. */
                            if(opt->flags & (CMDLINE_OPTFLAG_OPTIONALARG | CMDLINE_OPTFLAG_REQUIREDARG)) {
                                ret = callback(opt->id, argv[i]+2+len+1, userdata);
                            } else {
                                snprintf(auxbuf, CMDLINE_AUXBUF_SIZE, "--%s", opt->longname);
                                ret = callback(CMDLINE_OPTID_BOGUSARG, auxbuf, userdata);
                            }
                            break;
                        } else {
                            continue;
                        }
                    }
                } else if(opt->shortname != '\0'  &&  argv[i][0] == '-') {
                    if(argv[i][1] == opt->shortname) {
                        /* Regular short option. */
                        if(opt->flags & CMDLINE_OPTFLAG_REQUIREDARG) {
                            if(argv[i][2] != '\0')
                                ret = callback(opt->id, argv[i]+2, userdata);
                            else if(i+1 < argc)
                                ret = callback(opt->id, argv[++i], userdata);
                            else
                                ret = callback(CMDLINE_OPTID_MISSINGARG, argv[i], userdata);
                            break;
                        } else {
                            ret = callback(opt->id, NULL, userdata);

                            /* There might be more (argument-less) short options
                             * grouped together. */
                            if(ret == 0  &&  argv[i][2] != '\0')
                                ret = cmdline_handle_short_opt_group(options, argv[i]+2, callback, userdata);
                            break;
                        }
                    }
                }
            }

            if(opt->id == 0) {  /* still not handled? */
                if(argv[i][0] != '-') {
                    /* Non-option argument. */
                    ret = callback(CMDLINE_OPTID_NONE, argv[i], userdata);
                } else {
                    /* Unknown option. */
                    char* badoptname = argv[i];

                    if(strncmp(badoptname, "--", 2) == 0) {
                        /* Strip any argument from the long option. */
                        char* assignment = strchr(badoptname, '=');
                        if(assignment != NULL) {
                            size_t len = assignment - badoptname;
                            if(len > CMDLINE_AUXBUF_SIZE)
                                len = CMDLINE_AUXBUF_SIZE;
                            strncpy(auxbuf, badoptname, len);
                            auxbuf[len] = '\0';
                            badoptname = auxbuf;
                        }
                    }

                    ret = callback(CMDLINE_OPTID_UNKNOWN, badoptname, userdata);
                }
            }
        }

        if(ret != 0)
            return ret;
        i++;
    }

    return ret;
}